

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void leveldb::AddBoundaryInputs
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *level_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *compaction_files)

{
  pointer *pppFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  bool bVar3;
  InternalKey largest_key;
  FileMetaData *local_58;
  InternalKey local_50;
  
  paVar2 = &local_50.rep_.field_2;
  local_50.rep_._M_string_length = 0;
  local_50.rep_.field_2._M_local_buf[0] = '\0';
  local_50.rep_._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = FindLargestKey(icmp,compaction_files,&local_50);
  if (bVar3) {
    local_58 = FindSmallestBoundaryFile(icmp,level_files,&local_50);
    if (local_58 != (FileMetaData *)0x0) {
      do {
        __position._M_current =
             (compaction_files->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (compaction_files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
          _M_realloc_insert<leveldb::FileMetaData*const&>
                    ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                     compaction_files,__position,&local_58);
        }
        else {
          *__position._M_current = local_58;
          pppFVar1 = &(compaction_files->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        std::__cxx11::string::_M_assign((string *)&local_50);
        local_58 = FindSmallestBoundaryFile(icmp,level_files,&local_50);
      } while (local_58 != (FileMetaData *)0x0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.rep_._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.rep_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AddBoundaryInputs(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>& level_files,
                       std::vector<FileMetaData*>* compaction_files) {
  InternalKey largest_key;

  // Quick return if compaction_files is empty.
  if (!FindLargestKey(icmp, *compaction_files, &largest_key)) {
    return;
  }

  bool continue_searching = true;
  while (continue_searching) {
    FileMetaData* smallest_boundary_file =
        FindSmallestBoundaryFile(icmp, level_files, largest_key);

    // If a boundary file was found advance largest_key, otherwise we're done.
    if (smallest_boundary_file != NULL) {
      compaction_files->push_back(smallest_boundary_file);
      largest_key = smallest_boundary_file->largest;
    } else {
      continue_searching = false;
    }
  }
}